

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O0

vector<int,_std::allocator<int>_> *
phmap::priv::GenerateNumbersWithSeed
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,size_t n,int maxval,int seed)

{
  size_type sVar1;
  result_type rVar2;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_bool>
  local_98;
  int local_7c;
  size_type sStack_78;
  int value;
  size_t i;
  undefined1 local_60 [8];
  flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_> unique_values;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_28;
  minstd_rand0 rng;
  int seed_local;
  int maxval_local;
  size_t n_local;
  vector<int,_std::allocator<int>_> *values;
  
  rng._M_x._0_4_ = seed;
  rng._M_x._4_4_ = maxval;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_28,(long)seed);
  unique_values.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._7_1_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::flat_hash_set
            ((flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_> *)
             local_60);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  if (sVar1 < n) {
    for (sStack_78 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
        sStack_78 < n; sStack_78 = sStack_78 + 1) {
      do {
        rVar2 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
                operator()(&local_28);
        local_7c = (int)((long)((ulong)(uint)((int)rVar2 >> 0x1f) << 0x20 | rVar2 & 0xffffffff) %
                        (long)(rng._M_x._4_4_ + 1));
        raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
        ::insert<int,_0,_0>(&local_98,
                            (raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                             *)local_60,&local_7c);
      } while (((local_98.second ^ 0xffU) & 1) != 0);
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_7c);
    }
  }
  unique_values.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._7_1_ = 1;
  flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::~flat_hash_set
            ((flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_> *)
             local_60);
  if ((unique_values.
       super_raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
       .settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._7_1_ & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<int> GenerateNumbersWithSeed(size_t n, int maxval, int seed) {
        // NOTE: Some tests rely on generated numbers not changing between test runs.
        // We use std::minstd_rand0 because it is well-defined, but don't use
        // std::uniform_int_distribution because platforms use different algorithms.
        std::minstd_rand0 rng(seed);

        std::vector<int> values;
        phmap::flat_hash_set<int> unique_values;
        if (values.size() < n) {
            for (size_t i = values.size(); i < n; i++) {
                int value;
                do {
                    value = static_cast<int>(rng()) % (maxval + 1);
                } while (!unique_values.insert(value).second);

                values.push_back(value);
            }
        }
        return values;
    }